

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZMatrixSolver.cpp
# Opt level: O3

void __thiscall
TPZMatrixSolver<std::complex<float>_>::Write
          (TPZMatrixSolver<std::complex<float>_> *this,TPZStream *buf,int withclassid)

{
  TPZSavable::Write((TPZSavable *)this,buf,withclassid);
  TPZPersistenceManager::WritePointer((TPZSavable *)((this->fContainer).fRef)->fPointer,buf);
  TPZPersistenceManager::WritePointer((TPZSavable *)((this->fReferenceMatrix).fRef)->fPointer,buf);
  return;
}

Assistant:

void TPZMatrixSolver<TVar>::Write(TPZStream &buf, int withclassid) const {
#ifdef PZ_LOG
    {
        std::stringstream sout;
        sout << "Entering " << __PRETTY_FUNCTION__;
        LOGPZ_DEBUG(logger, sout.str());
    }
#endif
    TPZSolver::Write(buf, withclassid);
    if (fContainer) {
#ifdef PZ_LOG
        {
            std::stringstream sout;
            sout << "fContainer AutoPointer valid on " << __PRETTY_FUNCTION__;
            LOGPZ_DEBUG(logger, sout.str());
        }
#endif
    }
    TPZPersistenceManager::WritePointer(fContainer.operator->(), &buf);
    
    if (fReferenceMatrix) {
#ifdef PZ_LOG
        {
            std::stringstream sout;
            sout << "fReferenceMatrix AutoPointer valid! It Shouldn't ! Expect Trouble " << __PRETTY_FUNCTION__;
            LOGPZ_WARN(logger, sout.str());
        }
#endif
    }
    TPZPersistenceManager::WritePointer(fReferenceMatrix.operator->(), &buf);
    
#ifdef PZ_LOG
    {
        std::stringstream sout;
        sout << "Leaving" << __PRETTY_FUNCTION__;
        LOGPZ_DEBUG(logger, sout.str());
    }
#endif
}